

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 model_def_free(model_def_t *mdef)

{
  uint local_18;
  uint local_14;
  uint32 len;
  uint32 i;
  model_def_t *mdef_local;
  
  if (mdef->acmod_set != (acmod_set_t *)0x0) {
    if (mdef->acmod_set->ci != (ci_acmod_t *)0x0) {
      for (local_14 = 0; local_14 < mdef->acmod_set->n_ci; local_14 = local_14 + 1) {
        ckd_free(mdef->acmod_set->ci[local_14].name);
        if (mdef->acmod_set->ci[local_14].attrib != (char **)0x0) {
          for (local_18 = 0; mdef->acmod_set->ci[local_14].attrib[local_18] != (char *)0x0;
              local_18 = local_18 + 1) {
            ckd_free(mdef->acmod_set->ci[local_14].attrib[local_18]);
          }
          ckd_free(mdef->acmod_set->ci[local_14].attrib);
        }
      }
      ckd_free(mdef->acmod_set->ci);
    }
    mdef->acmod_set->ci = (ci_acmod_t *)0x0;
    if (mdef->acmod_set->multi != (acmod_t *)0x0) {
      for (local_14 = 0; local_14 < mdef->acmod_set->n_multi; local_14 = local_14 + 1) {
        if (mdef->acmod_set->multi[local_14].attrib != (char **)0x0) {
          for (local_18 = 0; mdef->acmod_set->multi[local_14].attrib[local_18] != (char *)0x0;
              local_18 = local_18 + 1) {
            ckd_free(mdef->acmod_set->multi[local_14].attrib[local_18]);
          }
          ckd_free(mdef->acmod_set->multi[local_14].attrib);
        }
      }
      ckd_free(mdef->acmod_set->multi);
    }
    mdef->acmod_set->multi = (acmod_t *)0x0;
    if (mdef->acmod_set->multi_idx != (itree_t **)0x0) {
      for (local_14 = 0; local_14 < mdef->acmod_set->n_ci; local_14 = local_14 + 1) {
        ckd_free(mdef->acmod_set->multi_idx[local_14]->cell);
        ckd_free(mdef->acmod_set->multi_idx[local_14]);
      }
      ckd_free(mdef->acmod_set->multi_idx);
    }
    mdef->acmod_set->multi_idx = (itree_t **)0x0;
    if (mdef->acmod_set->attrib != (char **)0x0) {
      for (local_18 = 0; mdef->acmod_set->attrib[local_18] != (char *)0x0; local_18 = local_18 + 1)
      {
        ckd_free(mdef->acmod_set->attrib[local_18]);
      }
      ckd_free(mdef->acmod_set->attrib);
    }
    mdef->acmod_set->attrib = (char **)0x0;
    if (mdef->acmod_set->n_with != (uint32 *)0x0) {
      ckd_free(mdef->acmod_set->n_with);
    }
    mdef->acmod_set->n_with = (uint32 *)0x0;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = (acmod_set_t *)0x0;
  if (mdef->defn != (model_def_entry_t *)0x0) {
    ckd_free(mdef->defn->state);
    for (local_14 = 0; local_14 < mdef->n_defn; local_14 = local_14 + 1) {
      if (mdef->defn[local_14].attrib != (char **)0x0) {
        for (local_18 = 0; mdef->defn[local_14].attrib[local_18] != (char *)0x0;
            local_18 = local_18 + 1) {
          ckd_free(mdef->defn[local_14].attrib[local_18]);
        }
        ckd_free(mdef->defn[local_14].attrib);
      }
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = (model_def_entry_t *)0x0;
  if (mdef->cb != (uint32 *)0x0) {
    ckd_free(mdef->cb);
  }
  mdef->cb = (uint32 *)0x0;
  if (mdef->ts2ci != (acmod_id_t *)0x0) {
    ckd_free(mdef->ts2ci);
  }
  mdef->ts2ci = (acmod_id_t *)0x0;
  ckd_free(mdef);
  return 0;
}

Assistant:

int32
model_def_free(model_def_t *mdef)
{
  uint32 i;
  uint32 len;

  if (mdef->acmod_set) {
    if (mdef->acmod_set->ci) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->ci[i].name);
	if (mdef->acmod_set->ci[i].attrib) {
	  for (len = 0; mdef->acmod_set->ci[i].attrib[len]; len++)
    	     ckd_free(mdef->acmod_set->ci[i].attrib[len]);
	  ckd_free(mdef->acmod_set->ci[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->ci);
    }
    mdef->acmod_set->ci = NULL;

    if (mdef->acmod_set->multi) {
      for (i = 0; i < mdef->acmod_set->n_multi; i ++) {
	if (mdef->acmod_set->multi[i].attrib) {
	  for (len = 0; mdef->acmod_set->multi[i].attrib[len]; len++)
	     ckd_free(mdef->acmod_set->multi[i].attrib[len]);
	  ckd_free(mdef->acmod_set->multi[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->multi);
    }
    mdef->acmod_set->multi = NULL;

    if (mdef->acmod_set->multi_idx) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->multi_idx[i]->cell);
	ckd_free(mdef->acmod_set->multi_idx[i]);
      }
      ckd_free(mdef->acmod_set->multi_idx);
    }
    mdef->acmod_set->multi_idx = NULL;

    if (mdef->acmod_set->attrib) {
      for (len = 0; mdef->acmod_set->attrib[len]; len++)
	  ckd_free(mdef->acmod_set->attrib[len]);
      ckd_free(mdef->acmod_set->attrib);
    }
    mdef->acmod_set->attrib = NULL;

    if (mdef->acmod_set->n_with)
      ckd_free(mdef->acmod_set->n_with);
    mdef->acmod_set->n_with = NULL;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = NULL;

  if (mdef->defn) {
    ckd_free(mdef->defn->state);
    for (i = 0; i < mdef->n_defn; i++) {
      if (mdef->defn[i].attrib) {
	for (len = 0; mdef->defn[i].attrib[len]; len++)
	    ckd_free(mdef->defn[i].attrib[len]);
	ckd_free(mdef->defn[i].attrib);
      }
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = NULL;

  if (mdef->cb)
    ckd_free(mdef->cb);
  mdef->cb = NULL;

  if (mdef->ts2ci)
    ckd_free(mdef->ts2ci);
  mdef->ts2ci = NULL;

  ckd_free(mdef);
  mdef = NULL;

  return S3_SUCCESS;
}